

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_5_item_assignment_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_INPLACE_DIV,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  G->val[-2] = G->ss;
  return;
}

Assistant:

YY_ACTION(void) yy_5_item_assignment_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define a G->val[-2]
  yyprintf((stderr, "do yy_5_item_assignment_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_INPLACE_DIV,      a, b); a=yy; }\n"));
  yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_INPLACE_DIV,      a, b); a=yy; ;
#undef b
#undef a
}